

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

StringRef llvm::dwarf::DecimalSignString(uint Sign)

{
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  StringRef SVar4;
  
  uVar3 = Sign - 1;
  pcVar1 = (char *)0x0;
  sVar2 = 0;
  if (uVar3 < 5) {
    pcVar1 = &DAT_00e758d0 + *(int *)(&DAT_00e758d0 + (ulong)uVar3 * 4);
    sVar2 = *(size_t *)(&DAT_00e758e8 + (ulong)uVar3 * 8);
  }
  SVar4.Length = sVar2;
  SVar4.Data = pcVar1;
  return SVar4;
}

Assistant:

StringRef llvm::dwarf::DecimalSignString(unsigned Sign) {
  switch (Sign) {
  case DW_DS_unsigned:
    return "DW_DS_unsigned";
  case DW_DS_leading_overpunch:
    return "DW_DS_leading_overpunch";
  case DW_DS_trailing_overpunch:
    return "DW_DS_trailing_overpunch";
  case DW_DS_leading_separate:
    return "DW_DS_leading_separate";
  case DW_DS_trailing_separate:
    return "DW_DS_trailing_separate";
  }
  return StringRef();
}